

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCatalogResolve(void)

{
  xmlChar *val;
  xmlChar *val_00;
  xmlChar *val_01;
  undefined4 local_34;
  int n_sysID;
  xmlChar *sysID;
  int n_pubID;
  xmlChar *pubID;
  xmlChar *ret_val;
  int test_ret;
  
  for (sysID._4_4_ = 0; sysID._4_4_ < 5; sysID._4_4_ = sysID._4_4_ + 1) {
    for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
      val = gen_const_xmlChar_ptr(sysID._4_4_,0);
      val_00 = gen_const_xmlChar_ptr(local_34,1);
      val_01 = (xmlChar *)xmlCatalogResolve(val,val_00);
      desret_xmlChar_ptr(val_01);
      call_tests = call_tests + 1;
      des_const_xmlChar_ptr(sysID._4_4_,val,0);
      des_const_xmlChar_ptr(local_34,val_00,1);
      xmlResetLastError();
    }
  }
  function_tests = function_tests + 1;
  return 0;
}

Assistant:

static int
test_xmlCatalogResolve(void) {
    int test_ret = 0;

#if defined(LIBXML_CATALOG_ENABLED)
    xmlChar * ret_val;
    const xmlChar * pubID; /* the public ID string */
    int n_pubID;
    const xmlChar * sysID; /* the system ID string */
    int n_sysID;

    for (n_pubID = 0;n_pubID < gen_nb_const_xmlChar_ptr;n_pubID++) {
    for (n_sysID = 0;n_sysID < gen_nb_const_xmlChar_ptr;n_sysID++) {
        pubID = gen_const_xmlChar_ptr(n_pubID, 0);
        sysID = gen_const_xmlChar_ptr(n_sysID, 1);

        ret_val = xmlCatalogResolve(pubID, sysID);
        desret_xmlChar_ptr(ret_val);
        call_tests++;
        des_const_xmlChar_ptr(n_pubID, pubID, 0);
        des_const_xmlChar_ptr(n_sysID, sysID, 1);
        xmlResetLastError();
    }
    }
    function_tests++;
#endif

    return(test_ret);
}